

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

int Map_ManCheckConsistency(Map_Man_t *p)

{
  Map_Node_t *p_00;
  int iVar1;
  Map_NodeVec_t *p_01;
  int local_24;
  int i;
  Map_NodeVec_t *pVec;
  Map_Node_t *pNode;
  Map_Man_t *p_local;
  
  p_01 = Map_MappingDfs(p,0);
  for (local_24 = 0; local_24 < p_01->nSize; local_24 = local_24 + 1) {
    p_00 = p_01->pArray[local_24];
    iVar1 = Map_NodeIsVar(p_00);
    if (iVar1 == 0) {
      iVar1 = Map_NodeIsConst(p_00);
      if (iVar1 == 0) {
        if (p_00->pRepr != (Map_Node_t *)0x0) {
          printf("Internal node %d is a secondary node.\n",(ulong)(uint)p_00->Num);
        }
        if (*(long *)(((ulong)p_00->p1 & 0xfffffffffffffffe) + 0x58) != 0) {
          printf("Internal node %d has first fanin that is a secondary node.\n",
                 (ulong)(uint)p_00->Num);
        }
        if (*(long *)(((ulong)p_00->p2 & 0xfffffffffffffffe) + 0x58) != 0) {
          printf("Internal node %d has second fanin that is a secondary node.\n",
                 (ulong)(uint)p_00->Num);
        }
      }
      else if (p_00->pRepr != (Map_Node_t *)0x0) {
        printf("Constant 1 %d is a secondary node.\n",(ulong)(uint)p_00->Num);
      }
    }
    else if (p_00->pRepr != (Map_Node_t *)0x0) {
      printf("Primary input %d is a secondary node.\n",(ulong)(uint)p_00->Num);
    }
  }
  Map_NodeVecFree(p_01);
  return 1;
}

Assistant:

int Map_ManCheckConsistency( Map_Man_t * p )
{
    Map_Node_t * pNode;
    Map_NodeVec_t * pVec;
    int i;
    pVec = Map_MappingDfs( p, 0 );
    for ( i = 0; i < pVec->nSize; i++ )
    {
        pNode = pVec->pArray[i];
        if ( Map_NodeIsVar(pNode) )
        {
            if ( pNode->pRepr )
                printf( "Primary input %d is a secondary node.\n", pNode->Num );
        }
        else if ( Map_NodeIsConst(pNode) )
        {
            if ( pNode->pRepr )
                printf( "Constant 1 %d is a secondary node.\n", pNode->Num );
        }
        else
        {
            if ( pNode->pRepr )
                printf( "Internal node %d is a secondary node.\n", pNode->Num );
            if ( Map_Regular(pNode->p1)->pRepr )
                printf( "Internal node %d has first fanin that is a secondary node.\n", pNode->Num );
            if ( Map_Regular(pNode->p2)->pRepr )
                printf( "Internal node %d has second fanin that is a secondary node.\n", pNode->Num );
        }
    }
    Map_NodeVecFree( pVec );
    return 1;
}